

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O1

int read_angle_delta(aom_reader *r,aom_cdf_prob *cdf)

{
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  int iVar4;
  byte bVar5;
  long lVar6;
  
  iVar4 = od_ec_decode_cdf_q15(&r->ec,cdf,7);
  if (r->allow_update_cdf != '\0') {
    uVar1 = cdf[7];
    bVar5 = (char)(uVar1 >> 4) + 5;
    lVar6 = 0;
    do {
      uVar2 = cdf[lVar6];
      if (lVar6 < (char)iVar4) {
        sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar5 & 0x1f));
      }
      else {
        sVar3 = -(uVar2 >> (bVar5 & 0x1f));
      }
      cdf[lVar6] = sVar3 + uVar2;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    cdf[7] = cdf[7] + (ushort)(uVar1 < 0x20);
  }
  return iVar4 + -3;
}

Assistant:

static int read_angle_delta(aom_reader *r, aom_cdf_prob *cdf) {
  const int sym = aom_read_symbol(r, cdf, 2 * MAX_ANGLE_DELTA + 1, ACCT_STR);
  return sym - MAX_ANGLE_DELTA;
}